

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsingleshottimer.cpp
# Opt level: O0

void __thiscall
QSingleShotTimer::QSingleShotTimer
          (QSingleShotTimer *this,Duration interval,TimerType timerType,QObject *r,
          QSlotObjectBase *slotObj)

{
  long lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QSlotObjectBase *in_stack_00000040;
  void **in_stack_00000048;
  QObject *in_stack_00000050;
  int signal_index;
  int in_stack_000000c0;
  int *in_stack_000000c8;
  QMetaObject *in_stack_000000d0;
  QMetaObject *in_stack_ffffffffffffff70;
  Connection *this_00;
  QObject *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QObject *receiver;
  TimerType in_stack_ffffffffffffffac;
  QSingleShotTimer *in_stack_ffffffffffffffb0;
  Duration interval_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  interval_00.__r = (rep)in_RDI;
  QAbstractEventDispatcher::instance((QThread *)in_stack_ffffffffffffff70);
  QObject::QObject((QObject *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
  *in_RDI = &PTR_metaObject_00be7850;
  receiver = (QObject *)(in_RDI + 2);
  QBasicTimer::QBasicTimer((QBasicTimer *)receiver);
  QMetaObjectPrivate::signalOffset(in_stack_ffffffffffffff70);
  this_00 = (Connection *)0x0;
  QObjectPrivate::connectImpl
            (r,slotObj._4_4_,in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_000000c0
             ,in_stack_000000c8,in_stack_000000d0);
  QMetaObject::Connection::~Connection(this_00);
  startTimerForReceiver(in_stack_ffffffffffffffb0,interval_00,in_stack_ffffffffffffffac,receiver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSingleShotTimer::QSingleShotTimer(Duration interval, Qt::TimerType timerType,
                                   const QObject *r, QtPrivate::QSlotObjectBase *slotObj)
    : QObject(QAbstractEventDispatcher::instance())
{
    int signal_index = QMetaObjectPrivate::signalOffset(&staticMetaObject);
    Q_ASSERT(QMetaObjectPrivate::signal(&staticMetaObject, signal_index).name() == "timeout");
    QObjectPrivate::connectImpl(this, signal_index, r ? r : this, nullptr, slotObj,
                                Qt::AutoConnection, nullptr, &staticMetaObject);

    startTimerForReceiver(interval, timerType, r);
}